

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

store * store_at(chunk_conflict2 *c,loc_conflict grid)

{
  town *ptVar1;
  town *ptVar2;
  int iVar3;
  wchar_t wVar4;
  ulong uVar5;
  _Bool _Var6;
  wchar_t wVar7;
  ulong uVar8;
  town *ptVar9;
  ulong uVar10;
  town *ptVar11;
  store *psVar12;
  bool bVar13;
  
  _Var6 = square_isshop((chunk_conflict *)c,(loc)grid);
  if (_Var6) {
    uVar8 = (ulong)world->num_towns;
    bVar13 = 0 < (long)uVar8;
    if ((long)uVar8 < 1) {
      ptVar9 = (town *)0x0;
    }
    else {
      ptVar9 = world->towns;
      iVar3 = world->levels[player->place].index;
      if (ptVar9->index != iVar3) {
        ptVar2 = ptVar9 + (world->num_towns - 1);
        uVar5 = 1;
        ptVar11 = ptVar9;
        do {
          uVar10 = uVar5;
          ptVar9 = ptVar2;
          if (uVar8 == uVar10) break;
          ptVar9 = ptVar11 + 1;
          ptVar1 = ptVar11 + 1;
          uVar5 = uVar10 + 1;
          ptVar11 = ptVar9;
        } while (ptVar1->index != iVar3);
        bVar13 = uVar10 < uVar8;
      }
    }
    if (bVar13) {
      psVar12 = (store *)&ptVar9->stores;
      while (psVar12 = psVar12->next, psVar12 != (store *)0x0) {
        wVar4 = psVar12->sidx;
        wVar7 = square_shopnum(cave,(loc)grid);
        if (wVar4 == wVar7) {
          return psVar12;
        }
      }
    }
  }
  return (store *)0x0;
}

Assistant:

struct store *store_at(struct chunk *c, struct loc grid)
{
	struct store *s = NULL;

	if (square_isshop(c, grid)) {
		struct level *lev = &world->levels[player->place];
		struct town *town = NULL;
		int i;
		for (i = 0; i < world->num_towns; i++) {
			town = &world->towns[i];
			if (town->index == lev->index) break;
		}
		if (i < world->num_towns) {
			for (s = town->stores; s; s = s->next) {
				if ((int) s->sidx == square_shopnum(cave, grid)) break;
			}
		}
	}

	return s;
}